

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::checkbox::checkbox(checkbox *this)

{
  string *psVar1;
  string *in_RDI;
  allocator *vtt;
  base_html_input *in_stack_ffffffffffffffc0;
  allocator local_29;
  string local_28 [8];
  base_widget *in_stack_ffffffffffffffe0;
  
  base_widget::base_widget(in_stack_ffffffffffffffe0);
  vtt = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"checkbox",vtt);
  base_html_input::base_html_input(in_stack_ffffffffffffffc0,(void **)vtt,in_RDI);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  *(undefined ***)in_RDI = &PTR__checkbox_0052cc00;
  *(undefined ***)(in_RDI + 3) = &PTR_render_0052cc80;
  booster::hold_ptr<cppcms::widgets::checkbox::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::checkbox::_data> *)&in_RDI[1].field_2._M_allocated_capacity)
  ;
  psVar1 = in_RDI + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((psVar1->field_2)._M_local_buf + 8),"y",
             (allocator *)&stack0xffffffffffffffc3);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc3);
  in_RDI[2].field_2._M_local_buf[8] = '\0';
  base_widget::set((base_widget *)(&in_RDI->_M_dataplus + *(long *)(*(long *)in_RDI + -0x18)),true);
  return;
}

Assistant:

checkbox::checkbox() : 
	base_html_input("checkbox"),
	identification_("y"),
	value_(false)
{
	set(true);	
}